

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

bool __thiscall
HighsHashTree<std::pair<int,_int>,_double>::contains
          (HighsHashTree<std::pair<int,_int>,_double> *this,pair<int,_int> *key)

{
  ulong uVar1;
  ValueType *pVVar2;
  ulong uVar3;
  
  uVar3 = (ulong)*key & 0xffffffff;
  uVar1 = (ulong)*key >> 0x20;
  pVVar2 = find_recurse((NodePtr)(this->root).ptrAndType,
                        (uVar1 + 0x80c8963be3e4c2f3) * (uVar3 + 0xc8497d2a400d9551) >> 0x20 ^
                        (uVar1 + 0x8a183895eeac1536) * (uVar3 + 0x42d8680e260ae5b),0,key);
  return pVVar2 != (ValueType *)0x0;
}

Assistant:

bool contains(const K& key) const {
    uint64_t hash = compute_hash(key);
    return find_recurse(root, hash, 0, key) != nullptr;
  }